

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O1

void __thiscall
cmGlobalNinjaGenerator::ComputeTargetDependsClosure
          (cmGlobalNinjaGenerator *this,cmGeneratorTarget *target,
          set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
          *depends)

{
  TargetType TVar1;
  TargetDependSet *pTVar2;
  _Base_ptr p_Var3;
  _Rb_tree_header *p_Var4;
  pair<std::_Rb_tree_iterator<const_cmGeneratorTarget_*>,_bool> pVar5;
  cmGeneratorTarget *local_30;
  
  pTVar2 = cmGlobalGenerator::GetTargetDirectDepends((cmGlobalGenerator *)this,target);
  p_Var3 = (pTVar2->
           super_set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>).
           _M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var4 = &(pTVar2->
            super_set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>).
            _M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var3 != p_Var4) {
    do {
      TVar1 = cmGeneratorTarget::GetType(*(cmGeneratorTarget **)(p_Var3 + 1));
      if (TVar1 != INTERFACE_LIBRARY) {
        local_30 = *(cmGeneratorTarget **)(p_Var3 + 1);
        pVar5 = std::
                _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                ::_M_insert_unique<cmGeneratorTarget_const*>
                          ((_Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                            *)depends,&local_30);
        if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          ComputeTargetDependsClosure(this,*(cmGeneratorTarget **)(p_Var3 + 1),depends);
        }
      }
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var4);
  }
  return;
}

Assistant:

void cmGlobalNinjaGenerator::ComputeTargetDependsClosure(
  cmGeneratorTarget const* target, std::set<cmGeneratorTarget const*>& depends)
{
  cmTargetDependSet const& targetDeps = this->GetTargetDirectDepends(target);
  for (cmTargetDependSet::const_iterator i = targetDeps.begin();
       i != targetDeps.end(); ++i) {
    if ((*i)->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
      continue;
    }
    if (depends.insert(*i).second) {
      this->ComputeTargetDependsClosure(*i, depends);
    }
  }
}